

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplication::setEffectEnabled(UIEffect effect,bool enable)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = uiEffectToFlag(effect);
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    QApplicationPrivate::enabledAnimations = QApplicationPrivate::enabledAnimations & ~uVar1;
  }
  else {
    QApplicationPrivate::enabledAnimations =
         uVar1 >> 1 & 0x12 | uVar1 | QApplicationPrivate::enabledAnimations;
  }
  return;
}

Assistant:

void QApplication::setEffectEnabled(Qt::UIEffect effect, bool enable)
{
    int effectFlags = uiEffectToFlag(effect);
    if (enable) {
        if (effectFlags & QPlatformTheme::FadeMenuUiEffect)
            effectFlags |= QPlatformTheme::AnimateMenuUiEffect;
        if (effectFlags & QPlatformTheme::FadeTooltipUiEffect)
            effectFlags |= QPlatformTheme::AnimateTooltipUiEffect;
        QApplicationPrivate::enabledAnimations |= effectFlags;
    } else {
        QApplicationPrivate::enabledAnimations &= ~effectFlags;
    }
}